

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdswitch.c
# Opt level: O1

boolean read_scan_script(j_compress_ptr cinfo,char *filename)

{
  j_compress_ptr pjVar1;
  boolean bVar2;
  FILE *__stream;
  jpeg_scan_info *__dest;
  uint uVar3;
  char *__format;
  int iVar4;
  long lVar5;
  int *piVar6;
  int termchar;
  long val;
  jpeg_scan_info scans [100];
  int local_e64;
  int local_e60 [2];
  char *local_e58;
  j_compress_ptr local_e50;
  int local_e48 [902];
  
  __stream = fopen(filename,"r");
  if (__stream == (FILE *)0x0) {
    bVar2 = 0;
    fprintf(_stderr,"Can\'t open scan definition file %s\n",filename);
  }
  else {
    local_e58 = filename;
    local_e50 = cinfo;
    bVar2 = read_scan_integer((FILE *)__stream,(long *)local_e60,&local_e64);
    uVar3 = 0;
    if (bVar2 != 0) {
      piVar6 = local_e48;
      do {
        if (uVar3 == 100) {
          __format = "Too many scans defined in file %s\n";
          goto LAB_0010748b;
        }
        piVar6[1] = local_e60[0];
        iVar4 = 1;
        if (local_e64 == 0x20) {
          lVar5 = 2;
          do {
            if (lVar5 == 5) {
              __format = "Too many components in one scan in file %s\n";
              goto LAB_0010748b;
            }
            bVar2 = read_scan_integer((FILE *)__stream,(long *)local_e60,&local_e64);
            if (bVar2 == 0) goto LAB_00107467;
            piVar6[lVar5] = local_e60[0];
            lVar5 = lVar5 + 1;
          } while (local_e64 == 0x20);
          iVar4 = (int)lVar5 + -1;
        }
        *piVar6 = iVar4;
        if (local_e64 == 0x3a) {
          bVar2 = read_scan_integer((FILE *)__stream,(long *)local_e60,&local_e64);
          if ((bVar2 != 0) && (local_e64 == 0x20)) {
            piVar6[5] = local_e60[0];
            bVar2 = read_scan_integer((FILE *)__stream,(long *)local_e60,&local_e64);
            if ((bVar2 != 0) && (local_e64 == 0x20)) {
              piVar6[6] = local_e60[0];
              bVar2 = read_scan_integer((FILE *)__stream,(long *)local_e60,&local_e64);
              if ((bVar2 != 0) && (local_e64 == 0x20)) {
                piVar6[7] = local_e60[0];
                bVar2 = read_scan_integer((FILE *)__stream,(long *)local_e60,&local_e64);
                iVar4 = local_e60[0];
                if (bVar2 != 0) goto LAB_001073da;
              }
            }
          }
LAB_00107467:
          __format = "Invalid scan entry format in file %s\n";
          goto LAB_0010748b;
        }
        piVar6[5] = 0;
        piVar6[6] = 0x3f;
        piVar6[7] = 0;
        iVar4 = 0;
LAB_001073da:
        piVar6[8] = iVar4;
        if ((local_e64 != -1) && (local_e64 != 0x3b)) goto LAB_00107467;
        piVar6 = piVar6 + 9;
        uVar3 = uVar3 + 1;
        bVar2 = read_scan_integer((FILE *)__stream,(long *)local_e60,&local_e64);
      } while (bVar2 != 0);
    }
    pjVar1 = local_e50;
    if (local_e64 == -1) {
      if (uVar3 != 0) {
        __dest = (jpeg_scan_info *)
                 (*local_e50->mem->alloc_small)((j_common_ptr)local_e50,1,(ulong)uVar3 * 0x24);
        memcpy(__dest,local_e48,(ulong)uVar3 * 0x24);
        pjVar1->scan_info = __dest;
        pjVar1->num_scans = uVar3;
      }
      fclose(__stream);
      bVar2 = 1;
    }
    else {
      __format = "Non-numeric data in file %s\n";
LAB_0010748b:
      bVar2 = 0;
      fprintf(_stderr,__format,local_e58);
      fclose(__stream);
    }
  }
  return bVar2;
}

Assistant:

GLOBAL(boolean)
read_scan_script(j_compress_ptr cinfo, char *filename)
/* Read a scan script from the specified text file.
 * Each entry in the file defines one scan to be emitted.
 * Entries are separated by semicolons ';'.
 * An entry contains one to four component indexes,
 * optionally followed by a colon ':' and four progressive-JPEG parameters.
 * The component indexes denote which component(s) are to be transmitted
 * in the current scan.  The first component has index 0.
 * Sequential JPEG is used if the progressive-JPEG parameters are omitted.
 * The file is free format text: any whitespace may appear between numbers
 * and the ':' and ';' punctuation marks.  Also, other punctuation (such
 * as commas or dashes) can be placed between numbers if desired.
 * Comments preceded by '#' may be included in the file.
 * Note: we do very little validity checking here;
 * jcmaster.c will validate the script parameters.
 */
{
  FILE *fp;
  int scanno, ncomps, termchar;
  long val;
  jpeg_scan_info *scanptr;
#define MAX_SCANS  100          /* quite arbitrary limit */
  jpeg_scan_info scans[MAX_SCANS];

  if ((fp = fopen(filename, "r")) == NULL) {
    fprintf(stderr, "Can't open scan definition file %s\n", filename);
    return FALSE;
  }
  scanptr = scans;
  scanno = 0;

  while (read_scan_integer(fp, &val, &termchar)) {
    if (scanno >= MAX_SCANS) {
      fprintf(stderr, "Too many scans defined in file %s\n", filename);
      fclose(fp);
      return FALSE;
    }
    scanptr->component_index[0] = (int)val;
    ncomps = 1;
    while (termchar == ' ') {
      if (ncomps >= MAX_COMPS_IN_SCAN) {
        fprintf(stderr, "Too many components in one scan in file %s\n",
                filename);
        fclose(fp);
        return FALSE;
      }
      if (!read_scan_integer(fp, &val, &termchar))
        goto bogus;
      scanptr->component_index[ncomps] = (int)val;
      ncomps++;
    }
    scanptr->comps_in_scan = ncomps;
    if (termchar == ':') {
      if (!read_scan_integer(fp, &val, &termchar) || termchar != ' ')
        goto bogus;
      scanptr->Ss = (int)val;
      if (!read_scan_integer(fp, &val, &termchar) || termchar != ' ')
        goto bogus;
      scanptr->Se = (int)val;
      if (!read_scan_integer(fp, &val, &termchar) || termchar != ' ')
        goto bogus;
      scanptr->Ah = (int)val;
      if (!read_scan_integer(fp, &val, &termchar))
        goto bogus;
      scanptr->Al = (int)val;
    } else {
      /* set non-progressive parameters */
      scanptr->Ss = 0;
      scanptr->Se = DCTSIZE2 - 1;
      scanptr->Ah = 0;
      scanptr->Al = 0;
    }
    if (termchar != ';' && termchar != EOF) {
bogus:
      fprintf(stderr, "Invalid scan entry format in file %s\n", filename);
      fclose(fp);
      return FALSE;
    }
    scanptr++, scanno++;
  }

  if (termchar != EOF) {
    fprintf(stderr, "Non-numeric data in file %s\n", filename);
    fclose(fp);
    return FALSE;
  }

  if (scanno > 0) {
    /* Stash completed scan list in cinfo structure.
     * NOTE: for cjpeg's use, JPOOL_IMAGE is the right lifetime for this data,
     * but if you want to compress multiple images you'd want JPOOL_PERMANENT.
     */
    scanptr = (jpeg_scan_info *)
      (*cinfo->mem->alloc_small) ((j_common_ptr)cinfo, JPOOL_IMAGE,
                                  scanno * sizeof(jpeg_scan_info));
    MEMCOPY(scanptr, scans, scanno * sizeof(jpeg_scan_info));
    cinfo->scan_info = scanptr;
    cinfo->num_scans = scanno;
  }

  fclose(fp);
  return TRUE;
}